

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_kv_cursor_data(unqlite_kv_cursor *pCursor,void *pBuf,unqlite_int64 *pnByte)

{
  undefined1 local_50 [8];
  SyBlob sBlob;
  int rc;
  unqlite_int64 *pnByte_local;
  void *pBuf_local;
  unqlite_kv_cursor *pCursor_local;
  
  if (pBuf == (void *)0x0) {
    sBlob._28_4_ = (*pCursor->pStore->pIo->pMethods->xDataLength)(pCursor,pnByte);
  }
  else {
    if (*pnByte < 0) {
      return -0x18;
    }
    SyBlobInitFromBuf((SyBlob *)local_50,pBuf,(sxu32)*pnByte);
    sBlob._28_4_ = (*pCursor->pStore->pIo->pMethods->xData)(pCursor,unqliteDataConsumer,local_50);
    *pnByte = (ulong)(uint)sBlob.pBlob;
    SyBlobRelease((SyBlob *)local_50);
  }
  return sBlob._28_4_;
}

Assistant:

int unqlite_kv_cursor_data(unqlite_kv_cursor *pCursor,void *pBuf,unqlite_int64 *pnByte)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	if( pBuf == 0 ){
		/* Data length only */
		rc = pCursor->pStore->pIo->pMethods->xDataLength(pCursor,pnByte);
	}else{
		SyBlob sBlob;
		if( (*pnByte) < 0 ){
			return UNQLITE_CORRUPT;
		}
		/* Initialize the data consumer */
		SyBlobInitFromBuf(&sBlob,pBuf,(sxu32)(*pnByte));
		/* Consume the data */
		rc = pCursor->pStore->pIo->pMethods->xData(pCursor,unqliteDataConsumer,&sBlob);
		/* Data length */
		*pnByte = SyBlobLength(&sBlob);
		/* Cleanup */
		SyBlobRelease(&sBlob);
	}
	return rc;
}